

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O3

void deqp::ub::anon_unknown_1::generateCompareSrc
               (ostringstream *src,char *resultVar,ShaderInterface *interface,UniformLayout *layout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *blockPointers,bool isVertex)

{
  UniformLayout *layout_00;
  int iVar1;
  undefined8 *puVar2;
  long *plVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  size_type *psVar8;
  VarType *pVVar9;
  pointer pBVar10;
  long lVar11;
  pointer pBVar12;
  long lVar13;
  char *__s;
  pointer pBVar14;
  ulong uVar15;
  byte bVar16;
  pointer pBVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string srcPrefix;
  string instancePostfix;
  string apiPrefix;
  string blockInstanceName;
  undefined4 in_stack_fffffffffffffd4c;
  deUint32 in_stack_fffffffffffffd50;
  VarType *local_2a0;
  long local_298;
  VarType local_290;
  int local_278;
  allocator<char> local_271;
  ulong *local_270;
  long local_268;
  ulong local_260 [2];
  long *local_250;
  long local_248;
  long local_240;
  undefined8 uStack_238;
  int local_230;
  uint local_22c;
  undefined8 *local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  uint local_1dc;
  UniformLayout *local_1d8;
  UniformLayout *local_1d0;
  char *local_1c8;
  long local_1c0;
  pointer local_1b8;
  ostringstream *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  lVar6 = *(long *)(resultVar + 0x18);
  lVar11 = *(long *)(resultVar + 0x20);
  if (0 < (int)((ulong)(lVar11 - lVar6) >> 3)) {
    bVar16 = (byte)blockPointers ^ 1;
    local_22c = (uint)bVar16 * 0x400 + 0x400;
    local_1dc = (uint)bVar16 * 0x100 + 0x100;
    pBVar17 = (pointer)&(layout->blocks).
                        super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    local_1c0 = 0;
    local_1d8 = layout;
    local_1d0 = (UniformLayout *)interface;
    local_1c8 = resultVar;
    local_1b8 = pBVar17;
    local_1b0 = src;
    do {
      local_228 = *(undefined8 **)(lVar6 + local_1c0 * 8);
      if ((*(uint *)((long)local_228 + 0x5c) & local_1dc) != 0) {
        lVar6 = local_228[5];
        lVar11 = local_228[4];
        local_230 = *(int *)(local_228 + 0xb);
        local_290.m_data._12_4_ = 1;
        if (1 < local_230) {
          local_290.m_data._12_4_ = local_230;
        }
        if (lVar11 != 0 && lVar6 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1a8,(char *)*local_228,(allocator<char> *)&local_220);
          plVar3 = (long *)std::__cxx11::string::append((char *)local_1a8);
          local_200 = &local_1f0;
          plVar7 = plVar3 + 2;
          if ((long *)*plVar3 == plVar7) {
            local_1f0 = *plVar7;
            lStack_1e8 = plVar3[3];
          }
          else {
            local_1f0 = *plVar7;
            local_200 = (long *)*plVar3;
          }
          local_1f8 = plVar3[1];
          *plVar3 = (long)plVar7;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_200 = &local_1f0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,0x1aee929);
        }
        if (local_230 < 1) {
          local_290.m_data._12_4_ = 1;
        }
        local_278 = 0;
        do {
          if (local_230 < 1) {
            local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,0x1aee929);
          }
          else {
            local_2a0 = &local_290;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"[","");
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::ostream::operator<<(local_1a8,local_278);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            uVar15 = 0xf;
            if (local_2a0 != &local_290) {
              uVar15 = local_290._0_8_;
            }
            if (uVar15 < (ulong)(local_268 + local_298)) {
              uVar15 = 0xf;
              if (local_270 != local_260) {
                uVar15 = local_260[0];
              }
              if (uVar15 < (ulong)(local_268 + local_298)) goto LAB_00ddc840;
              puVar2 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_270,0,(char *)0x0,(ulong)local_2a0);
            }
            else {
LAB_00ddc840:
              puVar2 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_270);
            }
            plVar3 = puVar2 + 2;
            if ((long *)*puVar2 == plVar3) {
              local_240 = *plVar3;
              uStack_238 = puVar2[3];
              local_250 = &local_240;
            }
            else {
              local_240 = *plVar3;
              local_250 = (long *)*puVar2;
            }
            local_248 = puVar2[1];
            *puVar2 = plVar3;
            puVar2[1] = 0;
            *(undefined1 *)plVar3 = 0;
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_250);
            local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
            psVar8 = (size_type *)(plVar3 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_220.field_2._M_allocated_capacity = *psVar8;
              local_220.field_2._8_8_ = plVar3[3];
            }
            else {
              local_220.field_2._M_allocated_capacity = *psVar8;
              local_220._M_dataplus._M_p = (pointer)*plVar3;
            }
            local_220._M_string_length = plVar3[1];
            *plVar3 = (long)psVar8;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            if (local_250 != &local_240) {
              operator_delete(local_250,local_240 + 1);
            }
            if (local_270 != local_260) {
              operator_delete(local_270,local_260[0] + 1);
            }
            if (local_2a0 != &local_290) {
              operator_delete(local_2a0,local_290._0_8_ + 1);
            }
          }
          std::operator+(local_1a8,(char *)*local_228,&local_220);
          puVar2 = local_228;
          if (lVar11 != 0 && lVar6 != 0) {
            __s = (char *)local_228[5];
            if (__s != (char *)0x0) {
              __s = (char *)local_228[4];
            }
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,__s,&local_271);
            plVar3 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_270,(ulong)local_220._M_dataplus._M_p);
            local_2a0 = &local_290;
            pVVar9 = (VarType *)(plVar3 + 2);
            if ((VarType *)*plVar3 == pVVar9) {
              local_290.m_type = pVVar9->m_type;
              local_290.m_flags = pVVar9->m_flags;
              local_290.m_data.array.elementType = (VarType *)plVar3[3];
            }
            else {
              local_290.m_type = pVVar9->m_type;
              local_290.m_flags = pVVar9->m_flags;
              local_2a0 = (VarType *)*plVar3;
            }
            local_298 = plVar3[1];
            *plVar3 = (long)pVVar9;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a0);
            plVar3 = puVar4 + 2;
            if ((long *)*puVar4 == plVar3) {
              local_240 = *plVar3;
              uStack_238 = puVar4[3];
              local_250 = &local_240;
            }
            else {
              local_240 = *plVar3;
              local_250 = (long *)*puVar4;
            }
            local_248 = puVar4[1];
            *puVar4 = plVar3;
            puVar4[1] = 0;
            *(undefined1 *)(puVar4 + 2) = 0;
            if (local_2a0 != &local_290) {
              operator_delete(local_2a0,local_290._0_8_ + 1);
            }
            if (local_270 != local_260) {
              operator_delete(local_270,local_260[0] + 1);
            }
          }
          else {
            local_250 = &local_240;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,0x1aee929);
            puVar2 = local_228;
          }
          iVar1 = UniformLayout::getBlockIndex(local_1d0,local_1a8[0]._M_dataplus._M_p);
          pBVar12 = (local_1d8->blocks).
                    super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pBVar10 = pBVar17;
          pBVar14 = pBVar17;
          if (pBVar12 != (pointer)0x0) {
            do {
              if (iVar1 <= pBVar12->size) {
                pBVar10 = pBVar12;
              }
              pBVar12 = *(pointer *)
                         ((long)&(pBVar12->name).field_2 + (ulong)(pBVar12->size < iVar1) * 8);
            } while (pBVar12 != (pointer)0x0);
            if ((pBVar10 != pBVar17) && (pBVar14 = pBVar10, iVar1 < pBVar10->size)) {
              pBVar14 = pBVar17;
            }
          }
          lVar13 = puVar2[8];
          lVar5 = puVar2[9];
          if (lVar13 != lVar5) {
            layout_00 = (UniformLayout *)
                        (pBVar14->activeUniformIndices).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
            do {
              if ((*(uint *)(lVar13 + 0x38) & local_22c) == 0) {
                local_2a0 = &local_290;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2a0,local_250,
                           (undefined1 *)(local_248 + (long)local_250));
                std::__cxx11::string::append((char *)&local_2a0);
                pVVar9 = local_2a0;
                local_270 = local_260;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_270,local_200,local_1f8 + (long)local_200);
                std::__cxx11::string::append((char *)&local_270);
                generateCompareSrc(local_1b0,(char *)(lVar13 + 0x20),pVVar9,(char *)local_270,
                                   (char *)local_1d0,layout_00,
                                   (void *)CONCAT44(in_stack_fffffffffffffd4c,local_22c),
                                   in_stack_fffffffffffffd50);
                if (local_270 != local_260) {
                  operator_delete(local_270,local_260[0] + 1);
                }
                if (local_2a0 != &local_290) {
                  operator_delete(local_2a0,local_290._0_8_ + 1);
                }
                lVar5 = local_228[9];
              }
              lVar13 = lVar13 + 0x40;
            } while (lVar13 != lVar5);
          }
          if (local_250 != &local_240) {
            operator_delete(local_250,local_240 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          pBVar17 = local_1b8;
          local_278 = local_278 + 1;
        } while (local_278 != local_290.m_data._12_4_);
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        lVar6 = *(long *)(local_1c8 + 0x18);
        lVar11 = *(long *)(local_1c8 + 0x20);
      }
      local_1c0 = local_1c0 + 1;
    } while (local_1c0 < (int)((ulong)(lVar11 - lVar6) >> 3));
  }
  return;
}

Assistant:

void generateCompareSrc(std::ostringstream& src, const char* resultVar, const ShaderInterface& interface,
						const UniformLayout& layout, const std::map<int, void*>& blockPointers, bool isVertex)
{
	deUint32 unusedMask = isVertex ? UNUSED_VERTEX : UNUSED_FRAGMENT;

	for (int blockNdx = 0; blockNdx < interface.getNumUniformBlocks(); blockNdx++)
	{
		const UniformBlock& block = interface.getUniformBlock(blockNdx);

		if ((block.getFlags() & (isVertex ? DECLARE_VERTEX : DECLARE_FRAGMENT)) == 0)
			continue; // Skip.

		bool		hasInstanceName = block.getInstanceName() != DE_NULL;
		bool		isArray			= block.isArray();
		int			numInstances	= isArray ? block.getArraySize() : 1;
		std::string apiPrefix		= hasInstanceName ? string(block.getBlockName()) + "." : string("");

		DE_ASSERT(!isArray || hasInstanceName);

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			std::string instancePostfix   = isArray ? string("[") + de::toString(instanceNdx) + "]" : string("");
			std::string blockInstanceName = block.getBlockName() + instancePostfix;
			std::string srcPrefix =
				hasInstanceName ? string(block.getInstanceName()) + instancePostfix + "." : string("");
			int   activeBlockNdx = layout.getBlockIndex(blockInstanceName.c_str());
			void* basePtr		 = blockPointers.find(activeBlockNdx)->second;

			for (UniformBlock::ConstIterator uniformIter = block.begin(); uniformIter != block.end(); uniformIter++)
			{
				const Uniform& uniform = *uniformIter;

				if (uniform.getFlags() & unusedMask)
					continue; // Don't read from that uniform.

				generateCompareSrc(src, resultVar, uniform.getType(), (srcPrefix + uniform.getName()).c_str(),
								   (apiPrefix + uniform.getName()).c_str(), layout, basePtr, unusedMask);
			}
		}
	}
}